

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotShadedEx<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>>
               (char *label_id,GetterXsYs<unsigned_char> *getter1,GetterXsYs<unsigned_char> *getter2
               ,bool fit2)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uchar *puVar9;
  uchar *puVar10;
  ImPlotPlot *pIVar11;
  ImPlotRange *pIVar12;
  ImPlotContext *pIVar13;
  bool bVar14;
  uint uVar15;
  ImU32 col;
  long lVar16;
  ImDrawList *DrawList;
  undefined7 in_register_00000009;
  uint uVar17;
  int iVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  byte local_88;
  byte local_84;
  TransformerLinLin local_7c;
  GetterXsYs<unsigned_char> *local_78;
  GetterXsYs<unsigned_char> *local_70;
  undefined4 local_64;
  ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLin>
  local_60;
  
  bVar14 = BeginItem(label_id,1);
  pIVar13 = GImPlot;
  if (bVar14) {
    if (GImPlot->FitThisFrame == true) {
      local_64 = (undefined4)CONCAT71(in_register_00000009,fit2);
      iVar3 = getter1->Count;
      if (0 < iVar3) {
        puVar9 = getter1->Xs;
        puVar10 = getter1->Ys;
        iVar4 = getter1->Offset;
        iVar5 = getter1->Stride;
        pIVar11 = GImPlot->CurrentPlot;
        iVar6 = pIVar11->CurrentYAxis;
        uVar7 = (pIVar11->XAxis).Flags;
        pIVar12 = GImPlot->ExtentsY;
        uVar8 = pIVar11->YAxis[iVar6].Flags;
        iVar18 = 0;
        uVar15 = uVar7 & 0x20;
        uVar17 = uVar8 & 0x20;
        do {
          lVar16 = (long)(((iVar4 + iVar18) % iVar3 + iVar3) % iVar3) * (long)iVar5;
          bVar1 = puVar9[lVar16];
          dVar20 = (double)bVar1;
          bVar2 = puVar10[lVar16];
          dVar19 = (double)bVar2;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((bVar1 != 0) || (uVar15 == 0)) {
LAB_001f0804:
              dVar21 = (pIVar13->ExtentsX).Min;
              dVar22 = dVar20;
              if (dVar21 <= dVar20) {
                dVar22 = dVar21;
              }
              (pIVar13->ExtentsX).Min = dVar22;
              dVar21 = (pIVar13->ExtentsX).Max;
              dVar22 = dVar20;
              if (dVar20 <= dVar21) {
                dVar22 = dVar21;
              }
              (pIVar13->ExtentsX).Max = dVar22;
            }
          }
          else if (((pIVar11->YAxis[iVar6].Range.Min <= dVar19) &&
                   (dVar19 <= pIVar11->YAxis[iVar6].Range.Max)) &&
                  (local_88 = (byte)(uVar15 >> 5), (bVar1 == 0 & local_88) == 0)) goto LAB_001f0804;
          if ((uVar8 >> 10 & 1) == 0) {
            if ((bVar2 != 0) || (uVar17 == 0)) {
LAB_001f085f:
              dVar20 = pIVar12[iVar6].Min;
              dVar21 = dVar19;
              if (dVar20 <= dVar19) {
                dVar21 = dVar20;
              }
              pIVar12[iVar6].Min = dVar21;
              dVar20 = pIVar13->ExtentsY[iVar6].Max;
              if (dVar19 <= dVar20) {
                dVar19 = dVar20;
              }
              pIVar13->ExtentsY[iVar6].Max = dVar19;
            }
          }
          else if ((((pIVar11->XAxis).Range.Min <= dVar20) && (dVar20 <= (pIVar11->XAxis).Range.Max)
                   ) && (local_84 = (byte)(uVar17 >> 5), (bVar2 == 0 & local_84) == 0))
          goto LAB_001f085f;
          iVar18 = iVar18 + 1;
        } while (iVar3 != iVar18);
      }
      if ((fit2) && (iVar3 = getter2->Count, 0 < iVar3)) {
        puVar9 = getter2->Xs;
        puVar10 = getter2->Ys;
        iVar4 = getter2->Offset;
        iVar5 = getter2->Stride;
        pIVar11 = pIVar13->CurrentPlot;
        iVar6 = pIVar11->CurrentYAxis;
        uVar7 = (pIVar11->XAxis).Flags;
        uVar8 = pIVar11->YAxis[iVar6].Flags;
        iVar18 = 0;
        uVar15 = uVar7 & 0x20;
        uVar17 = uVar8 & 0x20;
        do {
          lVar16 = (long)(((iVar4 + iVar18) % iVar3 + iVar3) % iVar3) * (long)iVar5;
          bVar1 = puVar9[lVar16];
          dVar20 = (double)bVar1;
          bVar2 = puVar10[lVar16];
          dVar19 = (double)bVar2;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((bVar1 != 0) || (uVar15 == 0)) {
LAB_001f0967:
              dVar21 = (pIVar13->ExtentsX).Min;
              dVar22 = dVar20;
              if (dVar21 <= dVar20) {
                dVar22 = dVar21;
              }
              (pIVar13->ExtentsX).Min = dVar22;
              dVar21 = (pIVar13->ExtentsX).Max;
              dVar22 = dVar20;
              if (dVar20 <= dVar21) {
                dVar22 = dVar21;
              }
              (pIVar13->ExtentsX).Max = dVar22;
            }
          }
          else if (((pIVar11->YAxis[iVar6].Range.Min <= dVar19) &&
                   (dVar19 <= pIVar11->YAxis[iVar6].Range.Max)) &&
                  (local_88 = (byte)(uVar15 >> 5), (bVar1 == 0 & local_88) == 0)) goto LAB_001f0967;
          if ((uVar8 >> 10 & 1) == 0) {
            if ((bVar2 != 0) || (uVar17 == 0)) {
LAB_001f09c3:
              dVar20 = pIVar13->ExtentsY[iVar6].Min;
              dVar21 = dVar19;
              if (dVar20 <= dVar19) {
                dVar21 = dVar20;
              }
              pIVar13->ExtentsY[iVar6].Min = dVar21;
              dVar20 = pIVar13->ExtentsY[iVar6].Max;
              if (dVar19 <= dVar20) {
                dVar19 = dVar20;
              }
              pIVar13->ExtentsY[iVar6].Max = dVar19;
            }
          }
          else if ((((pIVar11->XAxis).Range.Min <= dVar20) && (dVar20 <= (pIVar11->XAxis).Range.Max)
                   ) && (local_84 = (byte)(uVar17 >> 5), (bVar2 == 0 & local_84) == 0))
          goto LAB_001f09c3;
          iVar18 = iVar18 + 1;
        } while (iVar3 != iVar18);
      }
    }
    local_78 = getter2;
    local_70 = getter1;
    DrawList = GetPlotDrawList();
    if ((pIVar13->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar13->NextItemData).Colors + 1);
      switch(GImPlot->Scales[GImPlot->CurrentPlot->CurrentYAxis]) {
      case 0:
        local_7c.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLin>
        ::ShadedRenderer(&local_60,local_70,local_78,&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_7c.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLin>
                          *)&local_60,local_70,local_78,(TransformerLogLin *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_7c.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLog>
                          *)&local_60,local_70,local_78,(TransformerLinLog *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_7c.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLog>
                          *)&local_60,local_70,local_78,(TransformerLogLog *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar13 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar13->NextItemData);
    pIVar13->PreviousItem = pIVar13->CurrentItem;
    pIVar13->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}